

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comment.cc
# Opt level: O0

void __thiscall CommentDatabaseInternal::clear(CommentDatabaseInternal *this)

{
  Comment *this_00;
  bool bVar1;
  reference ppCVar2;
  _Self local_28;
  _Base_ptr local_20;
  _Rb_tree_const_iterator<Comment_*> local_18;
  iterator iter;
  CommentDatabaseInternal *this_local;
  
  iter._M_node = (_Base_ptr)this;
  std::_Rb_tree_const_iterator<Comment_*>::_Rb_tree_const_iterator(&local_18);
  local_20 = (_Base_ptr)
             std::set<Comment_*,_CommentOrder,_std::allocator<Comment_*>_>::begin(&this->commentset)
  ;
  local_18._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::set<Comment_*,_CommentOrder,_std::allocator<Comment_*>_>::end(&this->commentset);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    ppCVar2 = std::_Rb_tree_const_iterator<Comment_*>::operator*(&local_18);
    this_00 = *ppCVar2;
    if (this_00 != (Comment *)0x0) {
      Comment::~Comment(this_00);
      operator_delete(this_00);
    }
    std::_Rb_tree_const_iterator<Comment_*>::operator++(&local_18);
  }
  std::set<Comment_*,_CommentOrder,_std::allocator<Comment_*>_>::clear(&this->commentset);
  return;
}

Assistant:

void CommentDatabaseInternal::clear(void)

{
  CommentSet::iterator iter;

  for(iter=commentset.begin();iter!=commentset.end();++iter)
    delete *iter;
  commentset.clear();
}